

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClauseCodeTree.cpp
# Opt level: O2

bool __thiscall
Indexing::ClauseCodeTree::ClauseMatcher::existsCompatibleMatch
          (ClauseMatcher *this,ILStruct *si,MatchInfo *sq,ILStruct *targets)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  MatchInfo **ppMVar4;
  ulong uVar5;
  
  uVar1 = targets->matchCnt;
  uVar2 = 0;
  do {
    uVar5 = uVar2;
    if (uVar1 == uVar5) break;
    ppMVar4 = CodeTree::ILStruct::getMatch(targets,(uint)uVar5);
    bVar3 = compatible(this,si,sq,targets,*ppMVar4);
    uVar2 = uVar5 + 1;
  } while (!bVar3);
  return uVar5 < uVar1;
}

Assistant:

bool ClauseCodeTree::ClauseMatcher::existsCompatibleMatch(ILStruct* si, MatchInfo* sq, ILStruct* targets)
{
  size_t tcnt=targets->matchCnt;
  for(size_t i=0;i<tcnt;i++) {
    if(compatible(si,sq,targets,targets->getMatch(i))) {
      return true;
    }
  }
  return false;
}